

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O1

void __thiscall
t_js_generator::generate_serialize_container
          (t_js_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  int *piVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  t_js_generator *this_00;
  string kiter;
  string viter;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 != '\0') {
      poVar3 = t_generator::indent((t_generator *)this,out);
      pcVar5 = "output.writeSetBegin(";
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"output.writeSetBegin(",0x15);
      type_to_enum_abi_cxx11_
                (&local_170,(t_js_generator *)pcVar5,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_170._M_dataplus._M_p,local_170._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,".length);",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      goto LAB_002a1ca9;
    }
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar2 != '\0') {
      poVar3 = t_generator::indent((t_generator *)this,out);
      pcVar5 = "output.writeListBegin(";
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"output.writeListBegin(",0x16);
      type_to_enum_abi_cxx11_
                (&local_170,(t_js_generator *)pcVar5,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_170._M_dataplus._M_p,local_170._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,".length);",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      goto LAB_002a1ca9;
    }
  }
  else {
    poVar3 = t_generator::indent((t_generator *)this,out);
    pcVar5 = "output.writeMapBegin(";
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"output.writeMapBegin(",0x15);
    type_to_enum_abi_cxx11_
              (&local_170,(t_js_generator *)pcVar5,*(t_type **)&ttype[1].super_t_doc.has_doc_);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_170._M_dataplus._M_p,local_170._M_string_length);
    this_00 = (t_js_generator *)0x3a9b9f;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    type_to_enum_abi_cxx11_(&local_150,this_00,*(t_type **)&ttype[1].annotations_._M_t._M_impl);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_150._M_dataplus._M_p,local_150._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Thrift.objectLength(",0x14);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"));",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
LAB_002a1ca9:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
  }
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 != '\0') {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"iter","");
      t_generator::tmp(&local_170,(t_generator *)this,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      poVar3 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"for (",5);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(this->js_let_type_)._M_dataplus._M_p,
                          (this->js_let_type_)._M_string_length);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_170._M_dataplus._M_p,local_170._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," in ",4);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") {",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar3 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"if (",4);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,".hasOwnProperty(",0x10);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_170._M_dataplus._M_p,local_170._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")) {",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_170._M_dataplus._M_p,local_170._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_170._M_dataplus._M_p,local_170._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"];",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_170._M_dataplus._M_p,
                 local_170._M_dataplus._M_p + local_170._M_string_length);
      generate_serialize_set_element(this,out,(t_set *)ttype,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      t_oop_generator::scope_down(&this->super_t_oop_generator,out);
      t_oop_generator::scope_down(&this->super_t_oop_generator,out);
      goto LAB_002a252b;
    }
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar2 != '\0') {
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"iter","");
      t_generator::tmp(&local_170,(t_generator *)this,&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      poVar3 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"for (",5);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(this->js_let_type_)._M_dataplus._M_p,
                          (this->js_let_type_)._M_string_length);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_170._M_dataplus._M_p,local_170._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," in ",4);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") {",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar3 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"if (",4);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,".hasOwnProperty(",0x10);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_170._M_dataplus._M_p,local_170._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")) {",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_170._M_dataplus._M_p,local_170._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_170._M_dataplus._M_p,local_170._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"];",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,local_170._M_dataplus._M_p,
                 local_170._M_dataplus._M_p + local_170._M_string_length);
      generate_serialize_list_element(this,out,(t_list *)ttype,&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      t_oop_generator::scope_down(&this->super_t_oop_generator,out);
      t_oop_generator::scope_down(&this->super_t_oop_generator,out);
      goto LAB_002a252b;
    }
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"kiter","");
    t_generator::tmp(&local_170,(t_generator *)this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"viter","");
    t_generator::tmp(&local_150,(t_generator *)this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    poVar3 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"for (",5);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(this->js_let_type_)._M_dataplus._M_p,
                        (this->js_let_type_)._M_string_length);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_170._M_dataplus._M_p,local_170._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," in ",4);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") {",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar3 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"if (",4);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".hasOwnProperty(",0x10);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_170._M_dataplus._M_p,local_170._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")) {",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(this->js_let_type_)._M_dataplus._M_p,
                        (this->js_let_type_)._M_string_length);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_150._M_dataplus._M_p,local_150._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_170._M_dataplus._M_p,local_170._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"];",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_170._M_dataplus._M_p,
               local_170._M_dataplus._M_p + local_170._M_string_length);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_150._M_dataplus._M_p,
               local_150._M_dataplus._M_p + local_150._M_string_length);
    generate_serialize_map_element(this,out,(t_map *)ttype,&local_90,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
LAB_002a252b:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
  }
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar2 == '\0') {
        return;
      }
      poVar3 = t_generator::indent((t_generator *)this,out);
      pcVar5 = "output.writeListEnd();";
      lVar4 = 0x16;
      goto LAB_002a258c;
    }
    poVar3 = t_generator::indent((t_generator *)this,out);
    pcVar5 = "output.writeSetEnd();";
  }
  else {
    poVar3 = t_generator::indent((t_generator *)this,out);
    pcVar5 = "output.writeMapEnd();";
  }
  lVar4 = 0x15;
LAB_002a258c:
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,lVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_js_generator::generate_serialize_container(ostream& out, t_type* ttype, string prefix) {
  if (ttype->is_map()) {
    indent(out) << "output.writeMapBegin(" << type_to_enum(((t_map*)ttype)->get_key_type()) << ", "
                << type_to_enum(((t_map*)ttype)->get_val_type()) << ", "
                << "Thrift.objectLength(" << prefix << "));" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "output.writeSetBegin(" << type_to_enum(((t_set*)ttype)->get_elem_type()) << ", "
                << prefix << ".length);" << endl;

  } else if (ttype->is_list()) {

    indent(out) << "output.writeListBegin(" << type_to_enum(((t_list*)ttype)->get_elem_type())
                << ", " << prefix << ".length);" << endl;
  }

  if (ttype->is_map()) {
    string kiter = tmp("kiter");
    string viter = tmp("viter");
    indent(out) << "for (" << js_let_type_ << kiter << " in " << prefix << ") {" << endl;
    indent_up();
    indent(out) << "if (" << prefix << ".hasOwnProperty(" << kiter << ")) {" << endl;
    indent_up();
    indent(out) << js_let_type_ << viter << " = " << prefix << "[" << kiter << "];" << endl;
    generate_serialize_map_element(out, (t_map*)ttype, kiter, viter);
    scope_down(out);
    scope_down(out);

  } else if (ttype->is_set()) {
    string iter = tmp("iter");
    indent(out) << "for (" << js_let_type_ << iter << " in " << prefix << ") {" << endl;
    indent_up();
    indent(out) << "if (" << prefix << ".hasOwnProperty(" << iter << ")) {" << endl;
    indent_up();
    indent(out) << iter << " = " << prefix << "[" << iter << "];" << endl;
    generate_serialize_set_element(out, (t_set*)ttype, iter);
    scope_down(out);
    scope_down(out);

  } else if (ttype->is_list()) {
    string iter = tmp("iter");
    indent(out) << "for (" << js_let_type_ << iter << " in " << prefix << ") {" << endl;
    indent_up();
    indent(out) << "if (" << prefix << ".hasOwnProperty(" << iter << ")) {" << endl;
    indent_up();
    indent(out) << iter << " = " << prefix << "[" << iter << "];" << endl;
    generate_serialize_list_element(out, (t_list*)ttype, iter);
    scope_down(out);
    scope_down(out);
  }

  if (ttype->is_map()) {
    indent(out) << "output.writeMapEnd();" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "output.writeSetEnd();" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "output.writeListEnd();" << endl;
  }
}